

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int async_func_init(JSContext *ctx,JSAsyncFunctionState *s,JSValue func_obj,JSValue this_obj,
                   int argc,JSValue *argv)

{
  ushort uVar1;
  long lVar2;
  JSValue v;
  int iVar3;
  void *pvVar4;
  JSValueUnion *pJVar5;
  long *plVar6;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  JSValueUnion *in_RSI;
  JSContext *in_RDI;
  JSValueUnion in_R8;
  int64_t in_R9;
  JSValue JVar7;
  int in_stack_00000008;
  long in_stack_00000010;
  int n;
  int arg_buf_len;
  int i;
  int local_count;
  JSStackFrame *sf;
  JSFunctionBytecode *b;
  JSObject *p;
  size_t in_stack_ffffffffffffff50;
  JSContext *ctx_00;
  uint uStack_9c;
  JSValueUnion local_90;
  JSValueUnion local_88;
  JSValueUnion local_80;
  JSValueUnion local_78;
  JSValueUnion local_70;
  JSValueUnion local_68;
  int local_58;
  int local_4;
  
  init_list_head((list_head *)(in_RSI + 8));
  lVar2 = *(long *)((long)in_RDX.ptr + 0x30);
  *(uint *)((long)in_RSI + 0x5c) = (uint)*(byte *)(lVar2 + 0x18);
  in_RSI[10] = *(JSValueUnion *)(lVar2 + 0x20);
  iVar3 = max_int((uint)*(ushort *)(lVar2 + 0x40),in_stack_00000008);
  ctx_00 = in_RDI;
  max_int(iVar3 + (uint)*(ushort *)(lVar2 + 0x42) + (uint)*(ushort *)(lVar2 + 0x46),1);
  pvVar4 = js_malloc(ctx_00,in_stack_ffffffffffffff50);
  in_RSI[6].ptr = pvVar4;
  if (in_RSI[6].ptr == (void *)0x0) {
    local_4 = -1;
  }
  else {
    v.tag = in_RCX;
    v.u.ptr = in_RDX.ptr;
    JVar7 = JS_DupValue(in_RDI,v);
    local_70 = JVar7.u;
    in_RSI[4] = local_70;
    local_68 = (JSValueUnion)JVar7.tag;
    in_RSI[5] = local_68;
    JVar7.tag = in_R9;
    JVar7.u.float64 = in_R8.float64;
    pJVar5 = in_RSI;
    JVar7 = JS_DupValue(in_RDI,JVar7);
    local_80 = JVar7.u;
    *pJVar5 = local_80;
    local_78 = (JSValueUnion)JVar7.tag;
    pJVar5[1] = local_78;
    in_RSI[2].int32 = in_stack_00000008;
    in_RSI[0xb].int32 = iVar3;
    in_RSI[7].ptr = (void *)((long)in_RSI[6].ptr + (long)iVar3 * 0x10);
    in_RSI[0xc].ptr =
         (void *)((long)in_RSI[7].ptr + (long)(int)(uint)*(ushort *)(lVar2 + 0x42) * 0x10);
    for (local_58 = 0; local_58 < in_stack_00000008; local_58 = local_58 + 1) {
      pJVar5 = (JSValueUnion *)((long)in_RSI[6].ptr + (long)local_58 * 0x10);
      JVar7 = JS_DupValue(in_RDI,*(JSValue *)(in_stack_00000010 + (long)local_58 * 0x10));
      local_90 = JVar7.u;
      *pJVar5 = local_90;
      local_88 = (JSValueUnion)JVar7.tag;
      pJVar5[1] = local_88;
    }
    uVar1 = *(ushort *)(lVar2 + 0x42);
    for (local_58 = in_stack_00000008; local_58 < (int)(iVar3 + (uint)uVar1);
        local_58 = local_58 + 1) {
      plVar6 = (long *)((long)in_RSI[6].ptr + (long)local_58 * 0x10);
      *plVar6 = (ulong)uStack_9c << 0x20;
      plVar6[1] = 3;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static __exception int async_func_init(JSContext *ctx, JSAsyncFunctionState *s,
                                       JSValueConst func_obj, JSValueConst this_obj,
                                       int argc, JSValueConst *argv)
{
    JSObject *p;
    JSFunctionBytecode *b;
    JSStackFrame *sf;
    int local_count, i, arg_buf_len, n;

    sf = &s->frame;
    init_list_head(&sf->var_ref_list);
    p = JS_VALUE_GET_OBJ(func_obj);
    b = p->u.func.function_bytecode;
    sf->js_mode = b->js_mode;
    sf->cur_pc = b->byte_code_buf;
    arg_buf_len = max_int(b->arg_count, argc);
    local_count = arg_buf_len + b->var_count + b->stack_size;
    sf->arg_buf = js_malloc(ctx, sizeof(JSValue) * max_int(local_count, 1));
    if (!sf->arg_buf)
        return -1;
    sf->cur_func = JS_DupValue(ctx, func_obj);
    s->this_val = JS_DupValue(ctx, this_obj);
    s->argc = argc;
    sf->arg_count = arg_buf_len;
    sf->var_buf = sf->arg_buf + arg_buf_len;
    sf->cur_sp = sf->var_buf + b->var_count;
    for(i = 0; i < argc; i++)
        sf->arg_buf[i] = JS_DupValue(ctx, argv[i]);
    n = arg_buf_len + b->var_count;
    for(i = argc; i < n; i++)
        sf->arg_buf[i] = JS_UNDEFINED;
    return 0;
}